

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TupleValue::TupleValue
          (TupleValue *this,Arena *arena,bool is_message_owned)

{
  bool is_message_owned_local;
  Arena *arena_local;
  TupleValue *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TupleValue_006f09d0;
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Value>::RepeatedPtrField
            (&this->values_,arena);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  SharedCtor(this);
  if (!is_message_owned) {
    RegisterArenaDtor(this,arena);
  }
  return;
}

Assistant:

TupleValue::TupleValue(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  values_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.MILSpec.TupleValue)
}